

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vpm.cc
# Opt level: O0

int X509_VERIFY_PARAM_set1_ip_asc(X509_VERIFY_PARAM *param,char *ipasc)

{
  int iVar1;
  size_t iplen;
  uchar ipout [16];
  char *ipasc_local;
  X509_VERIFY_PARAM *param_local;
  
  iVar1 = x509v3_a2i_ipadd((uint8_t *)&iplen,ipasc);
  if ((long)iVar1 == 0) {
    param_local._4_4_ = 0;
  }
  else {
    param_local._4_4_ = X509_VERIFY_PARAM_set1_ip(param,(uchar *)&iplen,(long)iVar1);
  }
  return param_local._4_4_;
}

Assistant:

int X509_VERIFY_PARAM_set1_ip_asc(X509_VERIFY_PARAM *param, const char *ipasc) {
  unsigned char ipout[16];
  size_t iplen;

  iplen = (size_t)x509v3_a2i_ipadd(ipout, ipasc);
  if (iplen == 0) {
    return 0;
  }
  return X509_VERIFY_PARAM_set1_ip(param, ipout, iplen);
}